

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O3

void __thiscall
sglr::rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::releaseReference
          (ObjectManager<sglr::rc::ShaderProgramObjectContainer> *this,
          ShaderProgramObjectContainer *object)

{
  int *piVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>_>_>
  pVar2;
  key_type_conflict local_14;
  
  piVar1 = &(object->super_NamedObject).m_refCount;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  pVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>_>_>
          ::equal_range(&(this->m_objects)._M_t,&local_14);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>_>_>
  ::_M_erase_aux(&(this->m_objects)._M_t,(_Base_ptr)pVar2.first._M_node,
                 (_Base_ptr)pVar2.second._M_node);
  (*(object->super_NamedObject)._vptr_NamedObject[1])(object);
  return;
}

Assistant:

void			decRefCount			(void)			{ DE_ASSERT(m_refCount > 0); m_refCount -= 1;	}